

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
wasm::SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::pop_back
          (SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL> *this)

{
  pointer ppVar1;
  
  ppVar1 = (this->flexible).
           super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->flexible).
      super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
      ._M_impl.super__Vector_impl_data._M_start != ppVar1) {
    (this->flexible).
    super__Vector_base<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&ppVar1[-1].first.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
    Literal::~Literal(ppVar1[-1].first.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    return;
  }
  if (this->usedFixed != 0) {
    this->usedFixed = this->usedFixed - 1;
    return;
  }
  __assert_fail("usedFixed > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                ,0x51,
                "void wasm::SmallVector<std::pair<wasm::WasmException, wasm::Name>, 4>::pop_back() [T = std::pair<wasm::WasmException, wasm::Name>, N = 4]"
               );
}

Assistant:

void pop_back() {
    if (flexible.empty()) {
      assert(usedFixed > 0);
      usedFixed--;
    } else {
      flexible.pop_back();
    }
  }